

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

void TPZSkylMatrix<long_double>::InitializeElem
               (TPZVec<long> *skyline,TPZVec<long_double> *storage,TPZVec<long_double_*> *point)

{
  long lVar1;
  int64_t from;
  int64_t numelem;
  longdouble *plVar2;
  longdouble **pplVar3;
  long *plVar4;
  TPZVec<long_double_*> *in_RDX;
  TPZVec<long_double> *in_RSI;
  TPZVec<long> *in_RDI;
  int64_t i;
  int64_t nel;
  int64_t dim;
  TPZVec<long> *in_stack_ffffffffffffffb0;
  long local_40;
  
  from = TPZVec<long>::NElements(in_RDI);
  numelem = NumElements(in_stack_ffffffffffffffb0);
  (*in_RSI->_vptr_TPZVec[3])(in_RSI,numelem);
  TPZVec<long_double>::Fill(in_RSI,(longdouble *)in_RDX,from,numelem);
  (*in_RDX->_vptr_TPZVec[3])(in_RDX,from + 1);
  if (from == 0) {
    pplVar3 = TPZVec<long_double_*>::operator[](in_RDX,0);
    *pplVar3 = (longdouble *)0x0;
  }
  else {
    plVar2 = TPZVec<long_double>::operator[](in_RSI,0);
    pplVar3 = TPZVec<long_double_*>::operator[](in_RDX,0);
    *pplVar3 = plVar2;
    plVar2 = TPZVec<long_double>::operator[](in_RSI,0);
    pplVar3 = TPZVec<long_double_*>::operator[](in_RDX,from);
    *pplVar3 = plVar2 + numelem;
  }
  for (local_40 = 1; local_40 < from + 1; local_40 = local_40 + 1) {
    pplVar3 = TPZVec<long_double_*>::operator[](in_RDX,local_40 + -1);
    plVar2 = *pplVar3;
    plVar4 = TPZVec<long>::operator[](in_RDI,local_40 + -1);
    lVar1 = *plVar4;
    pplVar3 = TPZVec<long_double_*>::operator[](in_RDX,local_40);
    *pplVar3 = plVar2 + (local_40 - lVar1);
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::InitializeElem(const TPZVec<int64_t> &skyline, TPZVec<TVar> &storage, TPZVec<TVar *> &point) {   // JORGE 2013 OUTUBRO ???
	int64_t dim = skyline.NElements();
	int64_t nel = NumElements(skyline);
#ifdef PZDEBUG
    //	std::cout << "Skyline Matrix, Number of elements : " << nel << " in floating point " << nel*sizeof(TVar) << std::endl;
#endif
	storage.Resize(nel);
	storage.Fill(0.);
	int64_t i;
	point.Resize(dim+1);
	if(dim) {
		point[0] = &storage[0];
		point[dim] = &storage[0]+nel;
	} else {
		point[0] = 0;
	}
	for(i=1; i<dim+1; i++)
		point[i] = point[i-1]+(i-1)-skyline[i-1]+1;
}